

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall Hospital::Validate_username_password(Hospital *this,string *user,string *pass)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  
  sVar1 = user->_M_string_length;
  if (sVar1 == (this->Admin_Username)._M_string_length) {
    if (sVar1 != 0) {
      iVar2 = bcmp((user->_M_dataplus)._M_p,(this->Admin_Username)._M_dataplus._M_p,sVar1);
      if (iVar2 != 0) goto LAB_0011b986;
    }
    sVar1 = pass->_M_string_length;
    if (sVar1 == (this->Admin_Password)._M_string_length) {
      if (sVar1 != 0) {
        iVar2 = bcmp((pass->_M_dataplus)._M_p,(this->Admin_Password)._M_dataplus._M_p,sVar1);
        if (iVar2 != 0) goto LAB_0011b986;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"You entered successfully ...",0x1c);
      bVar3 = true;
      goto LAB_0011b9a0;
    }
  }
LAB_0011b986:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"your Username or Password is incorrect !!! ",0x2b);
  bVar3 = false;
LAB_0011b9a0:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return bVar3;
}

Assistant:

bool Hospital ::Validate_username_password(string user , string pass){
    if ((user != Admin_Username) || (pass != Admin_Password)){
        cout << "your Username or Password is incorrect !!! "<<endl;
        return false;
    }
    else {
        cout << "You entered successfully ..." << endl;
        return true;
    }
}